

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void idct32_stage9_sse4_1
               (__m128i *bf1,__m128i *out,int do_cols,int bd,int out_shift,__m128i *clamp_lo,
               __m128i *clamp_hi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  __m128i *palVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  __m128i rnding;
  int iVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  __m128i clamp_lo_out;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  iVar14 = (int)(*bf1)[0];
  iVar16 = *(int *)((long)*bf1 + 4);
  iVar18 = (int)(*bf1)[1];
  iVar20 = *(int *)((long)*bf1 + 0xc);
  iVar3 = (int)bf1[0x1f][0];
  iVar1 = *(int *)((long)bf1[0x1f] + 4);
  iVar4 = (int)bf1[0x1f][1];
  iVar2 = *(int *)((long)bf1[0x1f] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)*out = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)*out + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(*out + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28;
  *(uint *)((long)*out + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x1f] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x1f] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x1f] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x1f] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[1][0];
  iVar16 = *(int *)((long)bf1[1] + 4);
  iVar18 = (int)bf1[1][1];
  iVar20 = *(int *)((long)bf1[1] + 0xc);
  iVar3 = (int)bf1[0x1e][0];
  iVar1 = *(int *)((long)bf1[0x1e] + 4);
  iVar4 = (int)bf1[0x1e][1];
  iVar2 = *(int *)((long)bf1[0x1e] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[1] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[1] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[1] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28;
  *(uint *)((long)out[1] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x1e] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x1e] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x1e] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x1e] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[2][0];
  iVar16 = *(int *)((long)bf1[2] + 4);
  iVar18 = (int)bf1[2][1];
  iVar20 = *(int *)((long)bf1[2] + 0xc);
  iVar3 = (int)bf1[0x1d][0];
  iVar1 = *(int *)((long)bf1[0x1d] + 4);
  iVar4 = (int)bf1[0x1d][1];
  iVar2 = *(int *)((long)bf1[0x1d] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[2] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[2] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[2] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28;
  *(uint *)((long)out[2] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x1d] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x1d] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x1d] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x1d] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[3][0];
  iVar16 = *(int *)((long)bf1[3] + 4);
  iVar18 = (int)bf1[3][1];
  iVar20 = *(int *)((long)bf1[3] + 0xc);
  iVar3 = (int)bf1[0x1c][0];
  iVar1 = *(int *)((long)bf1[0x1c] + 4);
  iVar4 = (int)bf1[0x1c][1];
  iVar2 = *(int *)((long)bf1[0x1c] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[3] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[3] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[3] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28;
  *(uint *)((long)out[3] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x1c] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x1c] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x1c] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x1c] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[4][0];
  iVar16 = *(int *)((long)bf1[4] + 4);
  iVar18 = (int)bf1[4][1];
  iVar20 = *(int *)((long)bf1[4] + 0xc);
  iVar3 = (int)bf1[0x1b][0];
  iVar1 = *(int *)((long)bf1[0x1b] + 4);
  iVar4 = (int)bf1[0x1b][1];
  iVar2 = *(int *)((long)bf1[0x1b] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[4] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[4] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[4] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28;
  *(uint *)((long)out[4] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x1b] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x1b] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x1b] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x1b] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[5][0];
  iVar16 = *(int *)((long)bf1[5] + 4);
  iVar18 = (int)bf1[5][1];
  iVar20 = *(int *)((long)bf1[5] + 0xc);
  iVar3 = (int)bf1[0x1a][0];
  iVar1 = *(int *)((long)bf1[0x1a] + 4);
  iVar4 = (int)bf1[0x1a][1];
  iVar2 = *(int *)((long)bf1[0x1a] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[5] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[5] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[5] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28;
  *(uint *)((long)out[5] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x1a] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x1a] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x1a] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x1a] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[6][0];
  iVar16 = *(int *)((long)bf1[6] + 4);
  iVar18 = (int)bf1[6][1];
  iVar20 = *(int *)((long)bf1[6] + 0xc);
  iVar3 = (int)bf1[0x19][0];
  iVar1 = *(int *)((long)bf1[0x19] + 4);
  iVar4 = (int)bf1[0x19][1];
  iVar2 = *(int *)((long)bf1[0x19] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[6] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[6] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[6] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28;
  *(uint *)((long)out[6] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x19] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x19] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x19] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x19] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[7][0];
  iVar16 = *(int *)((long)bf1[7] + 4);
  iVar18 = (int)bf1[7][1];
  iVar20 = *(int *)((long)bf1[7] + 0xc);
  iVar3 = (int)bf1[0x18][0];
  iVar1 = *(int *)((long)bf1[0x18] + 4);
  iVar4 = (int)bf1[0x18][1];
  iVar2 = *(int *)((long)bf1[0x18] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[7] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[7] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[7] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28;
  *(uint *)((long)out[7] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x18] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x18] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x18] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x18] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[8][0];
  iVar16 = *(int *)((long)bf1[8] + 4);
  iVar18 = (int)bf1[8][1];
  iVar20 = *(int *)((long)bf1[8] + 0xc);
  iVar3 = (int)bf1[0x17][0];
  iVar1 = *(int *)((long)bf1[0x17] + 4);
  iVar4 = (int)bf1[0x17][1];
  iVar2 = *(int *)((long)bf1[0x17] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[8] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[8] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[8] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28;
  *(uint *)((long)out[8] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x17] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x17] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x17] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x17] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[9][0];
  iVar16 = *(int *)((long)bf1[9] + 4);
  iVar18 = (int)bf1[9][1];
  iVar20 = *(int *)((long)bf1[9] + 0xc);
  iVar3 = (int)bf1[0x16][0];
  iVar1 = *(int *)((long)bf1[0x16] + 4);
  iVar4 = (int)bf1[0x16][1];
  iVar2 = *(int *)((long)bf1[0x16] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[9] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[9] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[9] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28;
  *(uint *)((long)out[9] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x16] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x16] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x16] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x16] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[10][0];
  iVar16 = *(int *)((long)bf1[10] + 4);
  iVar18 = (int)bf1[10][1];
  iVar20 = *(int *)((long)bf1[10] + 0xc);
  iVar3 = (int)bf1[0x15][0];
  iVar1 = *(int *)((long)bf1[0x15] + 4);
  iVar4 = (int)bf1[0x15][1];
  iVar2 = *(int *)((long)bf1[0x15] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[10] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[10] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[10] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28;
  *(uint *)((long)out[10] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x15] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x15] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x15] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x15] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[0xb][0];
  iVar16 = *(int *)((long)bf1[0xb] + 4);
  iVar18 = (int)bf1[0xb][1];
  iVar20 = *(int *)((long)bf1[0xb] + 0xc);
  iVar3 = (int)bf1[0x14][0];
  iVar1 = *(int *)((long)bf1[0x14] + 4);
  iVar4 = (int)bf1[0x14][1];
  iVar2 = *(int *)((long)bf1[0x14] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[0xb] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[0xb] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[0xb] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28
  ;
  *(uint *)((long)out[0xb] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x14] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x14] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x14] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x14] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[0xc][0];
  iVar16 = *(int *)((long)bf1[0xc] + 4);
  iVar18 = (int)bf1[0xc][1];
  iVar20 = *(int *)((long)bf1[0xc] + 0xc);
  iVar3 = (int)bf1[0x13][0];
  iVar1 = *(int *)((long)bf1[0x13] + 4);
  iVar4 = (int)bf1[0x13][1];
  iVar2 = *(int *)((long)bf1[0x13] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[0xc] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[0xc] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[0xc] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28
  ;
  *(uint *)((long)out[0xc] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x13] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x13] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x13] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x13] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[0xd][0];
  iVar16 = *(int *)((long)bf1[0xd] + 4);
  iVar18 = (int)bf1[0xd][1];
  iVar20 = *(int *)((long)bf1[0xd] + 0xc);
  iVar3 = (int)bf1[0x12][0];
  iVar1 = *(int *)((long)bf1[0x12] + 4);
  iVar4 = (int)bf1[0x12][1];
  iVar2 = *(int *)((long)bf1[0x12] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[0xd] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[0xd] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[0xd] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28
  ;
  *(uint *)((long)out[0xd] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x12] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x12] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x12] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x12] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[0xe][0];
  iVar16 = *(int *)((long)bf1[0xe] + 4);
  iVar18 = (int)bf1[0xe][1];
  iVar20 = *(int *)((long)bf1[0xe] + 0xc);
  iVar3 = (int)bf1[0x11][0];
  iVar1 = *(int *)((long)bf1[0x11] + 4);
  iVar4 = (int)bf1[0x11][1];
  iVar2 = *(int *)((long)bf1[0x11] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[0xe] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[0xe] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[0xe] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28
  ;
  *(uint *)((long)out[0xe] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x11] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x11] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x11] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x11] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  iVar14 = (int)bf1[0xf][0];
  iVar16 = *(int *)((long)bf1[0xf] + 4);
  iVar18 = (int)bf1[0xf][1];
  iVar20 = *(int *)((long)bf1[0xf] + 0xc);
  iVar3 = (int)bf1[0x10][0];
  iVar1 = *(int *)((long)bf1[0x10] + 4);
  iVar4 = (int)bf1[0x10][1];
  iVar2 = *(int *)((long)bf1[0x10] + 0xc);
  iVar23 = iVar3 + iVar14;
  iVar25 = iVar1 + iVar16;
  iVar27 = iVar4 + iVar18;
  iVar29 = iVar2 + iVar20;
  iVar14 = iVar14 - iVar3;
  iVar16 = iVar16 - iVar1;
  iVar18 = iVar18 - iVar4;
  iVar20 = iVar20 - iVar2;
  iVar3 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar2 = *(int *)((long)*clamp_lo + 0xc);
  uVar24 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar26 = (uint)(iVar25 < iVar1) * iVar1 | (uint)(iVar25 >= iVar1) * iVar25;
  uVar28 = (uint)(iVar27 < iVar4) * iVar4 | (uint)(iVar27 >= iVar4) * iVar27;
  uVar30 = (uint)(iVar29 < iVar2) * iVar2 | (uint)(iVar29 >= iVar2) * iVar29;
  iVar23 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar15 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar4) * iVar4 | (uint)(iVar18 >= iVar4) * iVar18;
  uVar21 = (uint)(iVar20 < iVar2) * iVar2 | (uint)(iVar20 >= iVar2) * iVar20;
  *(uint *)out[0xf] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)((long)out[0xf] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(out[0xf] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28
  ;
  *(uint *)((long)out[0xf] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  *(uint *)out[0x10] = (uint)(iVar23 < (int)uVar15) * iVar23 | (iVar23 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0x10] + 4) =
       (uint)(iVar25 < (int)uVar17) * iVar25 | (iVar25 >= (int)uVar17) * uVar17;
  *(uint *)(out[0x10] + 1) =
       (uint)(iVar27 < (int)uVar19) * iVar27 | (iVar27 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[0x10] + 0xc) =
       (uint)(iVar29 < (int)uVar21) * iVar29 | (iVar29 >= (int)uVar21) * uVar21;
  if (do_cols == 0) {
    iVar14 = 10;
    if (10 < bd) {
      iVar14 = bd;
    }
    local_28 = 0x20 << ((byte)iVar14 & 0x1f);
    local_18 = -local_28;
    local_28 = local_28 + -1;
    iVar14 = 1 << ((char)out_shift - 1U & 0x1f);
    palVar12 = out + 7;
    uVar13 = 0xfffffffffffffff8;
    do {
      if (out_shift != 0) {
        iVar16 = *(int *)((long)palVar12[-7] + 4);
        lVar5 = palVar12[-7][1];
        iVar18 = *(int *)((long)palVar12[-7] + 0xc);
        lVar6 = palVar12[-6][0];
        iVar20 = *(int *)((long)palVar12[-6] + 4);
        lVar7 = palVar12[-6][1];
        iVar3 = *(int *)((long)palVar12[-6] + 0xc);
        lVar8 = palVar12[-5][0];
        iVar1 = *(int *)((long)palVar12[-5] + 4);
        lVar9 = palVar12[-5][1];
        iVar4 = *(int *)((long)palVar12[-5] + 0xc);
        lVar10 = palVar12[-4][0];
        iVar2 = *(int *)((long)palVar12[-4] + 4);
        lVar11 = palVar12[-4][1];
        iVar23 = *(int *)((long)palVar12[-4] + 0xc);
        auVar22 = ZEXT416((uint)out_shift);
        *(int *)palVar12[-7] = (int)palVar12[-7][0] + iVar14 >> auVar22;
        *(int *)((long)palVar12[-7] + 4) = iVar16 + iVar14 >> auVar22;
        *(int *)(palVar12[-7] + 1) = (int)lVar5 + iVar14 >> auVar22;
        *(int *)((long)palVar12[-7] + 0xc) = iVar18 + iVar14 >> auVar22;
        *(int *)palVar12[-6] = (int)lVar6 + iVar14 >> auVar22;
        *(int *)((long)palVar12[-6] + 4) = iVar20 + iVar14 >> auVar22;
        *(int *)(palVar12[-6] + 1) = (int)lVar7 + iVar14 >> auVar22;
        *(int *)((long)palVar12[-6] + 0xc) = iVar3 + iVar14 >> auVar22;
        *(int *)palVar12[-5] = (int)lVar8 + iVar14 >> auVar22;
        *(int *)((long)palVar12[-5] + 4) = iVar1 + iVar14 >> auVar22;
        *(int *)(palVar12[-5] + 1) = (int)lVar9 + iVar14 >> auVar22;
        *(int *)((long)palVar12[-5] + 0xc) = iVar4 + iVar14 >> auVar22;
        *(int *)palVar12[-4] = (int)lVar10 + iVar14 >> auVar22;
        *(int *)((long)palVar12[-4] + 4) = iVar2 + iVar14 >> auVar22;
        *(int *)(palVar12[-4] + 1) = (int)lVar11 + iVar14 >> auVar22;
        *(int *)((long)palVar12[-4] + 0xc) = iVar23 + iVar14 >> auVar22;
        iVar16 = *(int *)((long)palVar12[-3] + 4);
        lVar5 = palVar12[-3][1];
        iVar18 = *(int *)((long)palVar12[-3] + 0xc);
        lVar6 = palVar12[-2][0];
        iVar20 = *(int *)((long)palVar12[-2] + 4);
        lVar7 = palVar12[-2][1];
        iVar3 = *(int *)((long)palVar12[-2] + 0xc);
        lVar8 = palVar12[-1][0];
        iVar1 = *(int *)((long)palVar12[-1] + 4);
        lVar9 = palVar12[-1][1];
        iVar4 = *(int *)((long)palVar12[-1] + 0xc);
        lVar10 = (*palVar12)[0];
        iVar2 = *(int *)((long)*palVar12 + 4);
        lVar11 = (*palVar12)[1];
        iVar23 = *(int *)((long)*palVar12 + 0xc);
        *(int *)palVar12[-3] = (int)palVar12[-3][0] + iVar14 >> auVar22;
        *(int *)((long)palVar12[-3] + 4) = iVar16 + iVar14 >> auVar22;
        *(int *)(palVar12[-3] + 1) = (int)lVar5 + iVar14 >> auVar22;
        *(int *)((long)palVar12[-3] + 0xc) = iVar18 + iVar14 >> auVar22;
        *(int *)palVar12[-2] = (int)lVar6 + iVar14 >> auVar22;
        *(int *)((long)palVar12[-2] + 4) = iVar20 + iVar14 >> auVar22;
        *(int *)(palVar12[-2] + 1) = (int)lVar7 + iVar14 >> auVar22;
        *(int *)((long)palVar12[-2] + 0xc) = iVar3 + iVar14 >> auVar22;
        *(int *)palVar12[-1] = (int)lVar8 + iVar14 >> auVar22;
        *(int *)((long)palVar12[-1] + 4) = iVar1 + iVar14 >> auVar22;
        *(int *)(palVar12[-1] + 1) = (int)lVar9 + iVar14 >> auVar22;
        *(int *)((long)palVar12[-1] + 0xc) = iVar4 + iVar14 >> auVar22;
        *(int *)*palVar12 = (int)lVar10 + iVar14 >> auVar22;
        *(int *)((long)*palVar12 + 4) = iVar2 + iVar14 >> auVar22;
        *(int *)(*palVar12 + 1) = (int)lVar11 + iVar14 >> auVar22;
        *(int *)((long)*palVar12 + 0xc) = iVar23 + iVar14 >> auVar22;
      }
      uVar13 = uVar13 + 8;
      palVar12 = palVar12 + 8;
    } while (uVar13 < 0x18);
    iStack_24 = local_28;
    iStack_20 = local_28;
    iStack_1c = local_28;
    iStack_14 = local_18;
    iStack_10 = local_18;
    iStack_c = local_18;
    highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_18,(__m128i *)&local_28,0x20);
  }
  return;
}

Assistant:

static inline void idct32_stage9_sse4_1(__m128i *bf1, __m128i *out,
                                        const int do_cols, const int bd,
                                        const int out_shift,
                                        const __m128i *clamp_lo,
                                        const __m128i *clamp_hi) {
  addsub_sse4_1(bf1[0], bf1[31], out + 0, out + 31, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[1], bf1[30], out + 1, out + 30, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[2], bf1[29], out + 2, out + 29, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[3], bf1[28], out + 3, out + 28, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[4], bf1[27], out + 4, out + 27, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[5], bf1[26], out + 5, out + 26, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[6], bf1[25], out + 6, out + 25, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[7], bf1[24], out + 7, out + 24, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[8], bf1[23], out + 8, out + 23, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[9], bf1[22], out + 9, out + 22, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[10], bf1[21], out + 10, out + 21, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[11], bf1[20], out + 11, out + 20, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[12], bf1[19], out + 12, out + 19, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[13], bf1[18], out + 13, out + 18, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[14], bf1[17], out + 14, out + 17, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[15], bf1[16], out + 15, out + 16, clamp_lo, clamp_hi);

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    for (int i = 0; i < 32; i += 8) {
      round_shift_4x4(out + i, out_shift);
      round_shift_4x4(out + i + 4, out_shift);
    }
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 32);
  }
}